

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

intmatrix sptk::swipe::onesim(int xSz,int ySz)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  intmatrix iVar5;
  
  iVar5 = makeim(xSz,ySz);
  uVar2 = 0;
  uVar1 = iVar5._0_8_ >> 0x20;
  if (iVar5.y == 0 || (long)iVar5._0_8_ < 0) {
    uVar1 = uVar2;
  }
  uVar3 = 0;
  if (0 < iVar5.x) {
    uVar3 = (ulong)(uint)iVar5.x;
  }
  for (; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      iVar5.m[uVar2][uVar4] = 1;
    }
  }
  return iVar5;
}

Assistant:

intmatrix onesim(int xSz, int ySz) {
    int i, j;
    intmatrix nw_matrix = makeim(xSz, ySz);
    for (i = 0; i < nw_matrix.x; i++)
        for (j = 0; j < nw_matrix.y; j++)
            nw_matrix.m[i][j] = 1;
    return(nw_matrix);
}